

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_store_string(char **dest,char *src)

{
  size_t __n;
  char *__dest;
  
  __n = strlen(src);
  if (__n < 0xffff) {
    if (*dest != (char *)0x0) {
      free(*dest);
    }
    __dest = mcpl_internal_malloc(__n + 1);
    *dest = __dest;
    memcpy(__dest,src,__n);
    (*dest)[__n] = '\0';
    return;
  }
  (*mcpl_error_handler)("string length out of range");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_store_string(char** dest, const char * src)
{
  size_t n = strlen(src);
  if (n>65534) {
    n = 65534;
    mcpl_error("string length out of range");
  }
  if (*dest)
    free(*dest);
  *dest = mcpl_internal_malloc(n+1);

  //Usage of strncpy cause compiler warning on newer gcc, so we use memcpy
  //instead (should be safe, we just checked strlen above!):
  //strncpy( *dest,src,n );
  memcpy( *dest,src,n );
  (*dest)[n] = '\0';
  return;
}